

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<short>::test_all_algorithms
          (DivideTest<short> *this,short denom,set_t<short> *tested_denom)

{
  bool bVar1;
  iterator this_00;
  iterator __x;
  key_type *in_RDI;
  short in_stack_0000000e;
  undefined6 in_stack_00000010;
  short in_stack_00000016;
  DivideTest<short> *in_stack_00000018;
  set<short,_std::less<short>,_std::allocator<short>_> *in_stack_ffffffffffffffb8;
  set<short,_std::less<short>,_std::allocator<short>_> *in_stack_ffffffffffffffc8;
  
  this_00 = std::set<short,_std::less<short>,_std::allocator<short>_>::end
                      (in_stack_ffffffffffffffb8);
  __x = std::set<short,_std::less<short>,_std::allocator<short>_>::find
                  (in_stack_ffffffffffffffc8,in_RDI);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffd8);
  if (bVar1) {
    test_many<(libdivide::Branching)0>(in_stack_00000018,in_stack_00000016);
    test_many<(libdivide::Branching)1>
              ((DivideTest<short> *)CONCAT26(in_stack_00000016,in_stack_00000010),in_stack_0000000e)
    ;
    std::set<short,_std::less<short>,_std::allocator<short>_>::insert
              ((set<short,_std::less<short>,_std::allocator<short>_> *)this_00._M_node,
               (value_type_conflict *)__x._M_node);
  }
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }